

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O3

void __thiscall LibGens::Ym2612::update(Ym2612 *this,int32_t *bufL,int32_t *bufR,int length)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Ym2612Private *pYVar7;
  ulong uVar8;
  uint uVar9;
  
  pYVar7 = this->d;
  if ((pYVar7->state).CHANNEL[0]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(pYVar7,(pYVar7->state).CHANNEL);
    pYVar7 = this->d;
  }
  if ((pYVar7->state).CHANNEL[1]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(pYVar7,(pYVar7->state).CHANNEL + 1);
    pYVar7 = this->d;
  }
  if ((pYVar7->state).CHANNEL[2]._SLOT[0].Finc == -1) {
    if (((pYVar7->state).Mode & 0x40) == 0) {
      Ym2612Private::CALC_FINC_CH(pYVar7,(pYVar7->state).CHANNEL + 2);
      pYVar7 = this->d;
    }
    else {
      iVar4 = (pYVar7->state).CHANNEL[2].KC[2];
      (pYVar7->state).CHANNEL[2]._SLOT[0].Finc =
           ((pYVar7->FINC_TAB[(pYVar7->state).CHANNEL[2].FNUM[2]] >>
            (7U - (char)(pYVar7->state).CHANNEL[2].FOCT[2] & 0x1f)) +
           (pYVar7->state).CHANNEL[2]._SLOT[0].DT[iVar4]) * (pYVar7->state).CHANNEL[2]._SLOT[0].MUL;
      iVar4 = iVar4 >> ((byte)(pYVar7->state).CHANNEL[2]._SLOT[0].KSR_S & 0x1f);
      if ((pYVar7->state).CHANNEL[2]._SLOT[0].KSR != iVar4) {
        (pYVar7->state).CHANNEL[2]._SLOT[0].KSR = iVar4;
        puVar3 = (pYVar7->state).CHANNEL[2]._SLOT[0].DR;
        uVar9 = (pYVar7->state).CHANNEL[2]._SLOT[0].AR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[0].EincA = uVar9;
        uVar5 = puVar3[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[0].EincD = uVar5;
        uVar1 = (pYVar7->state).CHANNEL[2]._SLOT[0].SR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[0].EincS = uVar1;
        uVar2 = (pYVar7->state).CHANNEL[2]._SLOT[0].RR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[0].EincR = uVar2;
        iVar4 = (pYVar7->state).CHANNEL[2]._SLOT[0].Ecurp;
        if (((iVar4 == 0) || (uVar9 = uVar5, iVar4 == 1)) ||
           (((pYVar7->state).CHANNEL[2]._SLOT[0].Ecnt < 0x20000000 &&
            ((uVar9 = uVar1, iVar4 == 2 || (uVar9 = uVar2, iVar4 == 3)))))) {
          (pYVar7->state).CHANNEL[2]._SLOT[0].Einc = uVar9;
        }
      }
      iVar4 = (pYVar7->state).CHANNEL[2].KC[3];
      (pYVar7->state).CHANNEL[2]._SLOT[2].Finc =
           ((pYVar7->FINC_TAB[(pYVar7->state).CHANNEL[2].FNUM[3]] >>
            (7U - (char)(pYVar7->state).CHANNEL[2].FOCT[3] & 0x1f)) +
           (pYVar7->state).CHANNEL[2]._SLOT[2].DT[iVar4]) * (pYVar7->state).CHANNEL[2]._SLOT[2].MUL;
      iVar4 = iVar4 >> ((byte)(pYVar7->state).CHANNEL[2]._SLOT[2].KSR_S & 0x1f);
      if ((pYVar7->state).CHANNEL[2]._SLOT[2].KSR != iVar4) {
        (pYVar7->state).CHANNEL[2]._SLOT[2].KSR = iVar4;
        puVar3 = (pYVar7->state).CHANNEL[2]._SLOT[2].DR;
        uVar9 = (pYVar7->state).CHANNEL[2]._SLOT[2].AR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[2].EincA = uVar9;
        uVar5 = puVar3[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[2].EincD = uVar5;
        uVar1 = (pYVar7->state).CHANNEL[2]._SLOT[2].SR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[2].EincS = uVar1;
        uVar2 = (pYVar7->state).CHANNEL[2]._SLOT[2].RR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[2].EincR = uVar2;
        iVar4 = (pYVar7->state).CHANNEL[2]._SLOT[2].Ecurp;
        if (((iVar4 == 0) || (uVar9 = uVar5, iVar4 == 1)) ||
           (((pYVar7->state).CHANNEL[2]._SLOT[2].Ecnt < 0x20000000 &&
            ((uVar9 = uVar1, iVar4 == 2 || (uVar9 = uVar2, iVar4 == 3)))))) {
          (pYVar7->state).CHANNEL[2]._SLOT[2].Einc = uVar9;
        }
      }
      iVar4 = (pYVar7->state).CHANNEL[2].KC[1];
      (pYVar7->state).CHANNEL[2]._SLOT[1].Finc =
           ((pYVar7->FINC_TAB[(pYVar7->state).CHANNEL[2].FNUM[1]] >>
            (7U - (char)(pYVar7->state).CHANNEL[2].FOCT[1] & 0x1f)) +
           (pYVar7->state).CHANNEL[2]._SLOT[1].DT[iVar4]) * (pYVar7->state).CHANNEL[2]._SLOT[1].MUL;
      iVar4 = iVar4 >> ((byte)(pYVar7->state).CHANNEL[2]._SLOT[1].KSR_S & 0x1f);
      if ((pYVar7->state).CHANNEL[2]._SLOT[1].KSR != iVar4) {
        (pYVar7->state).CHANNEL[2]._SLOT[1].KSR = iVar4;
        puVar3 = (pYVar7->state).CHANNEL[2]._SLOT[1].DR;
        uVar9 = (pYVar7->state).CHANNEL[2]._SLOT[1].AR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[1].EincA = uVar9;
        uVar5 = puVar3[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[1].EincD = uVar5;
        uVar1 = (pYVar7->state).CHANNEL[2]._SLOT[1].SR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[1].EincS = uVar1;
        uVar2 = (pYVar7->state).CHANNEL[2]._SLOT[1].RR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[1].EincR = uVar2;
        iVar4 = (pYVar7->state).CHANNEL[2]._SLOT[1].Ecurp;
        if (((iVar4 == 0) || (uVar9 = uVar5, iVar4 == 1)) ||
           (((pYVar7->state).CHANNEL[2]._SLOT[1].Ecnt < 0x20000000 &&
            ((uVar9 = uVar1, iVar4 == 2 || (uVar9 = uVar2, iVar4 == 3)))))) {
          (pYVar7->state).CHANNEL[2]._SLOT[1].Einc = uVar9;
        }
      }
      iVar4 = (pYVar7->state).CHANNEL[2].KC[0];
      (pYVar7->state).CHANNEL[2]._SLOT[3].Finc =
           ((pYVar7->FINC_TAB[(pYVar7->state).CHANNEL[2].FNUM[0]] >>
            (7U - (char)(pYVar7->state).CHANNEL[2].FOCT[0] & 0x1f)) +
           (pYVar7->state).CHANNEL[2]._SLOT[3].DT[iVar4]) * (pYVar7->state).CHANNEL[2]._SLOT[3].MUL;
      iVar4 = iVar4 >> ((byte)(pYVar7->state).CHANNEL[2]._SLOT[3].KSR_S & 0x1f);
      if ((pYVar7->state).CHANNEL[2]._SLOT[3].KSR != iVar4) {
        (pYVar7->state).CHANNEL[2]._SLOT[3].KSR = iVar4;
        puVar3 = (pYVar7->state).CHANNEL[2]._SLOT[3].DR;
        uVar9 = (pYVar7->state).CHANNEL[2]._SLOT[3].AR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[3].EincA = uVar9;
        uVar5 = puVar3[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[3].EincD = uVar5;
        uVar1 = (pYVar7->state).CHANNEL[2]._SLOT[3].SR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[3].EincS = uVar1;
        uVar2 = (pYVar7->state).CHANNEL[2]._SLOT[3].RR[iVar4];
        (pYVar7->state).CHANNEL[2]._SLOT[3].EincR = uVar2;
        iVar4 = (pYVar7->state).CHANNEL[2]._SLOT[3].Ecurp;
        if (((iVar4 == 0) || (uVar9 = uVar5, iVar4 == 1)) ||
           (((pYVar7->state).CHANNEL[2]._SLOT[3].Ecnt < 0x20000000 &&
            ((uVar9 = uVar1, iVar4 == 2 || (uVar9 = uVar2, iVar4 == 3)))))) {
          (pYVar7->state).CHANNEL[2]._SLOT[3].Einc = uVar9;
        }
      }
    }
  }
  if ((pYVar7->state).CHANNEL[3]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(pYVar7,(pYVar7->state).CHANNEL + 3);
    pYVar7 = this->d;
  }
  if ((pYVar7->state).CHANNEL[4]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(pYVar7,(pYVar7->state).CHANNEL + 4);
    pYVar7 = this->d;
  }
  if ((pYVar7->state).CHANNEL[5]._SLOT[0].Finc == -1) {
    Ym2612Private::CALC_FINC_CH(pYVar7,(pYVar7->state).CHANNEL + 5);
    pYVar7 = this->d;
  }
  iVar4 = (pYVar7->state).LFOinc;
  uVar9 = ~(pYVar7->state).Inter_Step >> 10 & 0x10;
  if (iVar4 != 0) {
    if (0 < length) {
      uVar5 = (pYVar7->state).LFOcnt;
      uVar6 = 0;
      do {
        uVar5 = uVar5 + iVar4;
        (pYVar7->state).LFOcnt = uVar5;
        uVar8 = (ulong)(uVar5 >> 0x10 & 0xffc);
        pYVar7->LFO_ENV_UP[uVar6] = *(int *)((long)&Ym2612Private::LFO_ENV_TAB + uVar8);
        pYVar7->LFO_FREQ_UP[uVar6] = *(int *)((long)&Ym2612Private::LFO_FREQ_TAB + uVar8);
        uVar6 = uVar6 + 1;
      } while ((uint)length != uVar6);
    }
    uVar9 = uVar9 | 8;
  }
  Ym2612Private::Update_Chan
            (pYVar7,(pYVar7->state).CHANNEL[0].ALGO + uVar9,(pYVar7->state).CHANNEL,bufL,bufR,length
            );
  pYVar7 = this->d;
  Ym2612Private::Update_Chan
            (pYVar7,(pYVar7->state).CHANNEL[1].ALGO + uVar9,(pYVar7->state).CHANNEL + 1,bufL,bufR,
             length);
  pYVar7 = this->d;
  Ym2612Private::Update_Chan
            (pYVar7,(pYVar7->state).CHANNEL[2].ALGO + uVar9,(pYVar7->state).CHANNEL + 2,bufL,bufR,
             length);
  pYVar7 = this->d;
  Ym2612Private::Update_Chan
            (pYVar7,(pYVar7->state).CHANNEL[3].ALGO + uVar9,(pYVar7->state).CHANNEL + 3,bufL,bufR,
             length);
  pYVar7 = this->d;
  Ym2612Private::Update_Chan
            (pYVar7,(pYVar7->state).CHANNEL[4].ALGO + uVar9,(pYVar7->state).CHANNEL + 4,bufL,bufR,
             length);
  pYVar7 = this->d;
  if ((pYVar7->state).DAC == 0) {
    Ym2612Private::Update_Chan
              (pYVar7,uVar9 + (pYVar7->state).CHANNEL[5].ALGO,(pYVar7->state).CHANNEL + 5,bufL,bufR,
               length);
    pYVar7 = this->d;
  }
  (pYVar7->state).Inter_Cnt = pYVar7->int_cnt;
  return;
}

Assistant:

void Ym2612::update(int32_t *bufL, int32_t *bufR, int length)
{
//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG4,
//		"Starting generating sound...");

	// Mise à jour des pas des compteurs-fréquences s'ils ont été modifiés
 	if (d->state.CHANNEL[0]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[0]);
	}
	if (d->state.CHANNEL[1]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[1]);
	}
	if (d->state.CHANNEL[2]._SLOT[0].Finc == -1) {
		if (d->state.Mode & 0x40) {
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S0]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[2]] >> (7 - d->state.CHANNEL[2].FOCT[2]),
				d->state.CHANNEL[2].KC[2]);
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S1]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[3]] >> (7 - d->state.CHANNEL[2].FOCT[3]),
				d->state.CHANNEL[2].KC[3]);
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S2]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[1]] >> (7 - d->state.CHANNEL[2].FOCT[1]),
				d->state.CHANNEL[2].KC[1]);
			d->CALC_FINC_SL(&(d->state.CHANNEL[2]._SLOT[d->S3]),
				d->FINC_TAB[d->state.CHANNEL[2].FNUM[0]] >> (7 - d->state.CHANNEL[2].FOCT[0]),
				d->state.CHANNEL[2].KC[0]);
		} else {
			d->CALC_FINC_CH(&d->state.CHANNEL[2]);
		}
	}
	if (d->state.CHANNEL[3]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[3]);
	}
	if (d->state.CHANNEL[4]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[4]);
	}
	if (d->state.CHANNEL[5]._SLOT[0].Finc == -1) {
		d->CALC_FINC_CH(&d->state.CHANNEL[5]);
	}

	/*
	d->CALC_FINC_CH(&d->state.CHANNEL[0]);
	d->CALC_FINC_CH(&d->state.CHANNEL[1]);
	if (d->state.Mode & 0x40) {
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[0]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[2]] >> (7 - d->state.CHANNEL[2].FOCT[2]), YM2612.CHANNEL[2].KC[2]);
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[1]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[3]] >> (7 - d->state.CHANNEL[2].FOCT[3]), YM2612.CHANNEL[2].KC[3]);
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[2]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[1]] >> (7 - d->state.CHANNEL[2].FOCT[1]), YM2612.CHANNEL[2].KC[1]);
		d->CALC_FINC_SL(&(d->state.CHANNEL[2].SLOT[3]), d->FINC_TAB[d->state.CHANNEL[2].FNUM[0]] >> (7 - d->state.CHANNEL[2].FOCT[0]), d->state.CHANNEL[2].KC[0]);
	} else {
		d->CALC_FINC_CH(&d->state.CHANNEL[2]);
	}
	d->CALC_FINC_CH(&d->state.CHANNEL[3]);
	d->CALC_FINC_CH(&d->state.CHANNEL[4]);
	d->CALC_FINC_CH(&d->state.CHANNEL[5]);
	*/

	// Determine the algorithm type.
	int algo_type;
	if (d->state.Inter_Step & 0x04000) {
		algo_type = 0;
	} else {
		algo_type = 16;
	}

	if (d->state.LFOinc) {
		// Precalculate LFO wav

		for (int i = 0; i < length; i++) {
			int j = ((d->state.LFOcnt += d->state.LFOinc) >> LFO_LBITS) & d->LFO_MASK;

			d->LFO_ENV_UP[i] = d->LFO_ENV_TAB[j];
			d->LFO_FREQ_UP[i] = d->LFO_FREQ_TAB[j];

//			LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG4,
//				"LFO_ENV_UP[%d] = %d   LFO_FREQ_UP[%d] = %d",
//				i, d->LFO_ENV_UP[i], i, d->LFO_FREQ_UP[i]);
		}

		algo_type |= 8;
	}

	d->Update_Chan((d->state.CHANNEL[0].ALGO + algo_type), &(d->state.CHANNEL[0]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[1].ALGO + algo_type), &(d->state.CHANNEL[1]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[2].ALGO + algo_type), &(d->state.CHANNEL[2]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[3].ALGO + algo_type), &(d->state.CHANNEL[3]), bufL, bufR, length);
	d->Update_Chan((d->state.CHANNEL[4].ALGO + algo_type), &(d->state.CHANNEL[4]), bufL, bufR, length);
	if (!(d->state.DAC)) {
		// Update channel 6 only if DAC is disabled.
		d->Update_Chan((d->state.CHANNEL[5].ALGO + algo_type), &(d->state.CHANNEL[5]), bufL, bufR, length);
	}

	d->state.Inter_Cnt = d->int_cnt;

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG4,
//		"Finishing generating sound...");
}